

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.h
# Opt level: O2

_Bool prune_palette_testing_inter(AV1_COMP *cpi,uint source_variance)

{
  if ((((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) && (10 < (cpi->oxcf).speed)) &&
     ((cpi->rc).high_source_sad != 0)) {
    if (2 < (cpi->sf).rt_sf.prune_palette_search_nonrd) {
      return true;
    }
    if ((((cpi->sf).rt_sf.rc_compute_spatial_var_sc != 0) &&
        ((cpi->rc).frame_spatial_variance < 0x4b0)) && ((cpi->rc).perc_spatial_flat_blocks < 5)) {
      return source_variance < 4000 && 0x62 < (cpi->rc).percent_blocks_with_motion;
    }
  }
  return false;
}

Assistant:

static inline bool prune_palette_testing_inter(AV1_COMP *cpi,
                                               unsigned int source_variance) {
  return (
      cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN &&
      cpi->oxcf.speed >= 11 && cpi->rc.high_source_sad &&
      ((cpi->sf.rt_sf.prune_palette_search_nonrd > 2) ||
       (cpi->sf.rt_sf.rc_compute_spatial_var_sc &&
        cpi->rc.frame_spatial_variance < 1200 &&
        cpi->rc.perc_spatial_flat_blocks < 5 &&
        cpi->rc.percent_blocks_with_motion > 98 && source_variance < 4000)));
}